

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void icetSendRecvLargeMessages
               (IceTInt numMessagesSending,IceTInt *messageDestinations,IceTBoolean messagesInOrder,
               IceTGenerateData generateDataFunc,IceTHandleData handleDataFunc,
               IceTVoid *incomingBuffer,IceTSizeType bufferSize)

{
  size_t __size;
  char cVar1;
  IceTInt IVar2;
  int iVar3;
  IceTInt *pIVar4;
  IceTInt *pIVar5;
  IceTInt *pIVar6;
  void *sendbuf;
  void *recvbuf;
  void *__ptr;
  ulong uVar7;
  IceTVoid *pIVar8;
  int iVar9;
  ulong uVar10;
  undefined7 in_register_00000011;
  size_t __size_00;
  int iVar11;
  undefined4 in_register_0000003c;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  IceTInt rank;
  ulong local_d0;
  IceTInt *local_c8;
  ulong local_c0;
  size_t local_b8;
  IceTInt *local_b0;
  IceTInt *local_a8;
  IceTGenerateData local_a0;
  IceTVoid *local_98;
  ulong local_90;
  long local_88;
  IceTInt comm_size;
  IceTCommRequest requests [2];
  IceTSizeType data_size;
  
  local_d0 = CONCAT44(in_register_0000003c,numMessagesSending);
  local_88 = CONCAT44(local_88._4_4_,(int)CONCAT71(in_register_00000011,messagesInOrder));
  local_a0 = generateDataFunc;
  local_98 = incomingBuffer;
  icetGetIntegerv(3,&comm_size);
  icetGetIntegerv(2,&rank);
  pIVar4 = icetUnsafeStateGetInteger(0x29);
  pIVar5 = icetUnsafeStateGetInteger(0x2a);
  IVar2 = comm_size;
  local_90 = CONCAT44(local_90._4_4_,comm_size);
  __size_00 = (size_t)comm_size;
  __size = __size_00 * 4;
  local_b8 = __size_00;
  pIVar6 = (IceTInt *)malloc(__size);
  sendbuf = malloc(__size_00);
  recvbuf = malloc((ulong)(uint)(IVar2 * IVar2));
  local_a8 = (IceTInt *)malloc(__size);
  local_c8 = (IceTInt *)malloc(__size);
  __ptr = malloc(__size);
  uVar7 = 0;
  uVar10 = 0;
  if (0 < (int)local_b8) {
    uVar10 = local_90 & 0xffffffff;
  }
  for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    *(undefined1 *)((long)sendbuf + uVar7) = 0;
  }
  uVar10 = 0;
  uVar7 = local_d0 & 0xffffffff;
  if ((int)local_d0 < 1) {
    uVar7 = uVar10;
  }
  for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
    iVar3 = messageDestinations[uVar10];
    *(undefined1 *)((long)sendbuf + (long)iVar3) = 1;
    pIVar6[iVar3] = (IceTInt)uVar10;
  }
  cVar1 = *(char *)((long)sendbuf + (long)rank);
  *(undefined1 *)((long)sendbuf + (long)rank) = 0;
  local_b0 = pIVar6;
  icetCommAllgather(sendbuf,(IceTSizeType)local_90,0x8001,recvbuf);
  local_c0 = 0;
  uVar7 = 0;
  if (0 < comm_size) {
    uVar7 = (ulong)(uint)comm_size;
  }
  local_90 = (ulong)comm_size;
  local_d0 = local_d0 & 0xffffffff00000000;
  do {
    for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      *(undefined4 *)((long)__ptr + uVar10 * 4) = 0xffffffff;
    }
    uVar10 = 0;
    local_b8 = local_b8 & 0xffffffff00000000;
    while( true ) {
      lVar14 = (long)(int)local_d0;
      if (uVar10 == uVar7) break;
      for (uVar13 = 0; uVar13 != (uint)comm_size; uVar13 = uVar13 + 1) {
        if ((*(char *)((long)recvbuf + uVar13 + uVar10 * local_90) != '\0') &&
           (*(int *)((long)__ptr + uVar13 * 4) < 0)) {
          if ((char)local_88 != '\0') {
            iVar3 = pIVar5[uVar10];
            iVar11 = pIVar5[uVar13];
            iVar9 = iVar3;
            if (iVar11 < iVar3) {
              iVar9 = iVar11;
              iVar11 = iVar3;
            }
            lVar12 = (long)iVar9;
            do {
              lVar12 = lVar12 + 1;
              if (iVar11 <= lVar12) break;
            } while (*(char *)((long)recvbuf + (long)(pIVar4[lVar12] * comm_size + (int)uVar13)) ==
                     '\0');
            if ((int)lVar12 != iVar11) goto LAB_001175ec;
          }
          *(undefined1 *)((long)recvbuf + uVar13 + uVar10 * local_90) = 0;
          *(int *)((long)__ptr + uVar13 * 4) = (int)uVar10;
          local_b8 = CONCAT44(local_b8._4_4_,1);
          if (uVar10 == (uint)rank) {
            local_d0 = CONCAT44(local_d0._4_4_,(int)local_d0 + 1);
            local_a8[lVar14] = (int)uVar13;
            local_b8 = CONCAT44(local_b8._4_4_,1);
          }
          break;
        }
LAB_001175ec:
      }
      uVar10 = uVar10 + 1;
    }
    iVar3 = *(int *)((long)__ptr + (long)rank * 4);
    if (-1 < iVar3) {
      iVar11 = (int)local_c0;
      local_c0 = (ulong)(iVar11 + 1);
      local_c8[iVar11] = iVar3;
    }
    if ((int)local_b8 == 0) {
      if ((int)local_c0 < 1) {
        requests[0] = (IceTCommRequest)0x0;
      }
      else {
        startLargeRecv(local_98,bufferSize,*local_c8,requests);
      }
      if (cVar1 != '\0') {
        pIVar8 = (*local_a0)(local_b0[rank],rank,&data_size);
        (*handleDataFunc)(pIVar8,rank);
      }
      if ((int)local_d0 < 1) {
        requests[1] = (IceTCommRequest)0x0;
      }
      else {
        startLargeSend(*local_a8,requests + 1,local_a0,local_b0);
      }
      local_88 = (long)(int)local_c0;
      uVar7 = 0;
      lVar12 = 0;
LAB_00117702:
      lVar15 = lVar12;
      uVar10 = (long)(int)uVar7;
      do {
        uVar7 = uVar10;
        if (lVar14 <= (long)uVar7 && local_88 <= lVar15) {
          free(local_b0);
          free(sendbuf);
          free(recvbuf);
          free(local_a8);
          free(local_c8);
          free(__ptr);
          return;
        }
        while (iVar3 = icetCommWaitany(2,requests), iVar3 != 1) {
          if (iVar3 == 0) {
            (*handleDataFunc)(local_98,local_c8[lVar15]);
            lVar12 = lVar15 + 1;
            if ((int)lVar12 < (int)local_c0) {
              startLargeRecv(local_98,bufferSize,local_c8[lVar15 + 1],requests);
            }
            goto LAB_00117702;
          }
        }
        uVar10 = uVar7 + 1;
        if ((long)uVar10 < lVar14) {
          local_d0 = uVar10;
          startLargeSend(local_a8[uVar7 + 1],requests + 1,local_a0,local_b0);
          uVar10 = local_d0;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void icetSendRecvLargeMessages(IceTInt numMessagesSending,
                               IceTInt *messageDestinations,
                               IceTBoolean messagesInOrder,
                               IceTGenerateData generateDataFunc,
                               IceTHandleData handleDataFunc,
                               IceTVoid *incomingBuffer,
                               IceTSizeType bufferSize)
{
    IceTInt comm_size;
    IceTInt rank;
    IceTInt i;
    IceTInt sender;
    IceTInt numSend, numRecv;
    IceTInt someoneSends;
    IceTInt sendToSelf;
    IceTInt sqi, rqi;     /* Send/Recv queue index. */
    const IceTInt *composite_order;
    const IceTInt *process_orders;

    IceTInt *sendIds;
    IceTByte *myDests;
    IceTByte *allDests;
    IceTInt *sendQueue;
    IceTInt *recvQueue;
    IceTInt *recvFrom;

#define RECV_IDX 0
#define SEND_IDX 1
    IceTCommRequest requests[2];

    icetGetIntegerv(ICET_NUM_PROCESSES, &comm_size);
    icetGetIntegerv(ICET_RANK, &rank);

    composite_order = icetUnsafeStateGetInteger(ICET_COMPOSITE_ORDER);
    process_orders = icetUnsafeStateGetInteger(ICET_PROCESS_ORDERS);

    /* Allocate structures that manage who sends to what.
       YIKES, that allDests can get really big.  We will have to work around
       that in order to run on supercomputers.  (It is generally used for
       tiled displays.) */
    sendIds = malloc(comm_size * sizeof(IceTInt));
    myDests = malloc(comm_size);
    allDests = malloc(comm_size * comm_size);
    sendQueue = malloc(comm_size * sizeof(IceTInt));
    recvQueue = malloc(comm_size * sizeof(IceTInt));
    recvFrom = malloc(comm_size * sizeof(IceTInt));

  /* Convert array of ranks to a mask of ranks. */
    for (i = 0; i < comm_size; i++) {
        myDests[i] = 0;
    }
    for (i = 0; i < numMessagesSending; i++) {
        myDests[messageDestinations[i]] = 1;
        sendIds[messageDestinations[i]] = i;
    }

  /* We'll just handle send to self as a special case. */
    sendToSelf = myDests[rank];
    myDests[rank] = 0;

  /* Gather masks for all processes. */
    icetCommAllgather(myDests, comm_size, ICET_BYTE, allDests);

  /* Determine communications.  We will determine communications in a
     series of steps.  At each step, we will try to find the most send/recv
     pairs.  Each step will be able to complete without deadlock.  Rather
     than saving the sends and recieves per step, we will simply push them
     into queues and run the send and receive queues in parallel later. */
    numSend = 0;  numRecv = 0;
    do {
        someoneSends = 0;
      /* We are going to keep track of what every processor receives to
         ensure that no processor receives more than one message per
         iteration.  Clear out the array first. */
        for (i = 0; i < comm_size; i++) recvFrom[i] = -1;
      /* Try to find a destination for each sender. */
        for (sender = 0; sender < comm_size; sender++) {
            char *localDests = allDests + sender*comm_size;
            IceTInt receiver;
            for (receiver = 0; receiver < comm_size; receiver++) {
                if (localDests[receiver] && (recvFrom[receiver] < 0)) {
                    if (messagesInOrder) {
                      /* Make sure there is not another message that must
                         be sent first. */
                        IceTInt left, right;
                        if (process_orders[sender] < process_orders[receiver]) {
                            left = process_orders[sender];
                            right = process_orders[receiver];
                        } else {
                            left = process_orders[receiver];
                            right = process_orders[sender];
                        }
                        for (left++; left < right; left++) {
                            IceTInt p = composite_order[left];
                            if (allDests[p*comm_size + receiver]) break;
                        }
                        if (left != right) {
                          /* We have to wait for someone else to send
                             before we can send this one. */
                            continue;
                        }
                    }
                    localDests[receiver] = 0;
                  /* This is no longer necessary since we take care of
                     sentToSelf above
                     
                    if (sender == receiver) {
                        if (rank == sender) sendToSelf = 1;
                        continue;
                    }
                  */
                    recvFrom[receiver] = sender;
                    if (sender == rank) {
                        sendQueue[numSend++] = receiver;
                    }
                    someoneSends = 1;
                    break;
                }
            }
        }
      /* Check to see if we are receiving something this iteration. */
        if (recvFrom[rank] >= 0) {
            recvQueue[numRecv++] = recvFrom[rank];
        }
    } while (someoneSends);
#ifdef DEBUG
    for (i = 0; i < comm_size*comm_size; i++) {
        if (allDests[i] != 0) {
            icetRaiseError("Apperent deadlock encountered.",
                           ICET_SANITY_CHECK_FAIL);
        }
    }
#endif

    sqi = 0;  rqi = 0;
    if (rqi < numRecv) {
        icetRaiseDebug1("Receiving from %d", (int)recvQueue[rqi]);
        startLargeRecv(incomingBuffer, bufferSize, recvQueue[rqi],
                       &requests[RECV_IDX]);
    } else {
        requests[RECV_IDX] = ICET_COMM_REQUEST_NULL;
    }
    if (sendToSelf) {
        IceTSizeType data_size;
        IceTVoid *data;
        icetRaiseDebug("Sending to self.");
        data = (*generateDataFunc)(sendIds[rank], rank, &data_size);
        (*handleDataFunc)(data, rank);
    }
    if (sqi < numSend) {
        icetRaiseDebug1("Sending to %d", (int)sendQueue[sqi]);
        startLargeSend(sendQueue[sqi], &requests[SEND_IDX],
                       generateDataFunc, sendIds);
    } else {
        requests[SEND_IDX] = ICET_COMM_REQUEST_NULL;
    }
    while ((rqi < numRecv) || (sqi < numSend)) {
        icetRaiseDebug("Starting wait.");
        i = icetCommWaitany(2, requests);
        icetRaiseDebug1("Wait returned with %d finished.", (int)i);
        switch (i) {
          case RECV_IDX:
              icetRaiseDebug1("Receive from %d finished", (int)recvQueue[rqi]);
              (*handleDataFunc)(incomingBuffer, recvQueue[rqi]);
              rqi++;
              if (rqi < numRecv) {
                  icetRaiseDebug1("Receiving from %d", (int)recvQueue[rqi]);
                  startLargeRecv(incomingBuffer, bufferSize, recvQueue[rqi],
                                 &requests[RECV_IDX]);
              }
              continue;
          case SEND_IDX:
              icetRaiseDebug1("Send to %d finished", (int)sendQueue[sqi]);
              sqi++;
              if (sqi < numSend) {
                  icetRaiseDebug1("Sending to %d", (int)sendQueue[sqi]);
                  startLargeSend(sendQueue[sqi], &requests[SEND_IDX],
                                 generateDataFunc, sendIds);
              }
              continue;
        }
    }

    free(sendIds);
    free(myDests);
    free(allDests);
    free(sendQueue);
    free(recvQueue);
    free(recvFrom);
}